

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_eq_var(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  int iVar2;
  secp256k1_fe tmp;
  
  secp256k1_ge_verify(a);
  secp256k1_ge_verify(b);
  iVar2 = 0;
  if (a->infinity == b->infinity) {
    if (a->infinity == 0) {
      tmp.n[0] = (a->x).n[0];
      tmp.n[1] = (a->x).n[1];
      tmp.n[2] = (a->x).n[2];
      tmp.n[3] = (a->x).n[3];
      tmp.n[4] = (a->x).n[4];
      tmp.magnitude = (a->x).magnitude;
      tmp.normalized = (a->x).normalized;
      secp256k1_fe_normalize_weak(&tmp);
      iVar1 = secp256k1_fe_equal(&tmp,&b->x);
      iVar2 = 0;
      if (iVar1 != 0) {
        tmp.n[0] = (a->y).n[0];
        tmp.n[1] = (a->y).n[1];
        tmp.n[2] = (a->y).n[2];
        tmp.n[3] = (a->y).n[3];
        tmp.n[4] = (a->y).n[4];
        tmp.magnitude = (a->y).magnitude;
        tmp.normalized = (a->y).normalized;
        secp256k1_fe_normalize_weak(&tmp);
        iVar2 = secp256k1_fe_equal(&tmp,&b->y);
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ge_eq_var(const secp256k1_ge *a, const secp256k1_ge *b) {
    secp256k1_fe tmp;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity != b->infinity) return 0;
    if (a->infinity) return 1;

    tmp = a->x;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->x)) return 0;

    tmp = a->y;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->y)) return 0;

    return 1;
}